

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglxintegration.cpp
# Opt level: O0

void __thiscall QGLXContext::swapBuffers(QGLXContext *this,QPlatformSurface *surface)

{
  int iVar1;
  xcb_window_t xVar2;
  ulong uVar3;
  QGLXPbuffer *in_RSI;
  long in_RDI;
  QXcbWindow *platformWindow;
  GLXDrawable glxDrawable;
  QXcbWindow *local_38;
  GLXPbuffer local_18;
  
  QPlatformSurface::surface();
  iVar1 = QSurface::surfaceClass();
  if (iVar1 == 1) {
    local_18 = QGLXPbuffer::pbuffer(in_RSI);
  }
  else {
    if (in_RSI == (QGLXPbuffer *)0x0) {
      local_38 = (QXcbWindow *)0x0;
    }
    else {
      local_38 = (QXcbWindow *)&in_RSI[-1].m_screen;
    }
    xVar2 = QXcbWindow::xcb_window(local_38);
    local_18 = (GLXPbuffer)xVar2;
  }
  glXSwapBuffers(*(undefined8 *)(in_RDI + 0x18),local_18);
  QPlatformSurface::surface();
  iVar1 = QSurface::surfaceClass();
  if ((iVar1 == 0) && (uVar3 = QXcbWindow::needsSync(), (uVar3 & 1) != 0)) {
    QXcbWindow::postSyncWindowRequest();
  }
  return;
}

Assistant:

void QGLXContext::swapBuffers(QPlatformSurface *surface)
{
    GLXDrawable glxDrawable = 0;
    if (surface->surface()->surfaceClass() == QSurface::Offscreen)
        glxDrawable = static_cast<QGLXPbuffer *>(surface)->pbuffer();
    else
        glxDrawable = static_cast<QXcbWindow *>(surface)->xcb_window();
    glXSwapBuffers(m_display, glxDrawable);

    if (surface->surface()->surfaceClass() == QSurface::Window) {
        QXcbWindow *platformWindow = static_cast<QXcbWindow *>(surface);
        // OpenGL context might be bound to a non-gui thread use QueuedConnection to sync
        // the window from the platformWindow's thread as QXcbWindow is no QObject, an
        // event is sent to QXcbConnection. (this is faster than a metacall)
        if (platformWindow->needsSync())
            platformWindow->postSyncWindowRequest();
    }
}